

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O2

Builder * __thiscall
capnp::DynamicList::Builder::operator[](Builder *__return_storage_ptr__,Builder *this,uint index)

{
  double dVar1;
  byte bVar2;
  undefined2 uVar3;
  uint uVar4;
  SegmentBuilder *pSVar5;
  CapTableBuilder *pCVar6;
  StructPointerCount SVar7;
  undefined1 uVar8;
  ListElementCount LVar9;
  BitsPerElementN<23> BVar10;
  undefined8 uVar11;
  ElementSize EVar12;
  Which WVar13;
  StructSize elementSize;
  StructSchema SVar14;
  ulong uVar15;
  EnumSchema EVar16;
  InterfaceSchema IVar17;
  ListBuilder *__return_storage_ptr___00;
  Type TVar18;
  ArrayPtr<unsigned_char> AVar19;
  Schema in_stack_fffffffffffffed8;
  uint index_local;
  DebugComparison<unsigned_int_&,_unsigned_int> _kjCondition;
  Fault f;
  undefined1 local_d0 [24];
  char *pcStack_b8;
  size_t local_b0;
  StructBuilder local_a8;
  ListBuilder local_80;
  ListBuilder local_58;
  
  _kjCondition.left = &index_local;
  uVar4 = (this->builder).elementCount;
  _kjCondition.right = uVar4;
  _kjCondition.op.content.ptr = " < ";
  _kjCondition.op.content.size_ = 4;
  _kjCondition.result = index < uVar4;
  index_local = index;
  if (uVar4 <= index) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_int>&,char_const(&)[26]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x44a,FAILED,"index < size()","_kjCondition,\"List index out-of-bounds.\"",
               &_kjCondition,(char (*) [26])"List index out-of-bounds.");
    kj::_::Debug::Fault::fatal(&f);
  }
  WVar13 = LIST;
  if ((this->schema).elementType.listDepth == '\0') {
    WVar13 = (this->schema).elementType.baseType;
  }
  switch(WVar13) {
  case VOID:
    __return_storage_ptr__->type = VOID;
    break;
  case BOOL:
    bVar2 = (this->builder).ptr[index >> 3];
    __return_storage_ptr__->type = BOOL;
    (__return_storage_ptr__->field_1).boolValue = (bVar2 >> (index & 7) & 1) != 0;
    break;
  case INT8:
    uVar15 = (ulong)(char)(this->builder).ptr[(ulong)(this->builder).step * (ulong)index >> 3];
    goto LAB_00179a4c;
  case INT16:
    uVar15 = (ulong)*(short *)((this->builder).ptr +
                              ((ulong)(this->builder).step * (ulong)index >> 3));
    goto LAB_00179a4c;
  case INT32:
    uVar15 = (ulong)*(int *)((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index >> 3)
                            );
    goto LAB_00179a4c;
  case INT64:
    uVar15 = *(ulong *)((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index >> 3));
LAB_00179a4c:
    __return_storage_ptr__->type = INT;
LAB_00179aea:
    (__return_storage_ptr__->field_1).intValue = uVar15;
    break;
  case UINT8:
    uVar15 = (ulong)(this->builder).ptr[(ulong)(this->builder).step * (ulong)index >> 3];
    goto LAB_00179ae4;
  case UINT16:
    uVar15 = (ulong)*(ushort *)
                     ((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index >> 3));
    goto LAB_00179ae4;
  case UINT32:
    uVar15 = (ulong)*(uint *)((this->builder).ptr +
                             ((ulong)(this->builder).step * (ulong)index >> 3));
    goto LAB_00179ae4;
  case UINT64:
    uVar15 = *(ulong *)((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index >> 3));
LAB_00179ae4:
    __return_storage_ptr__->type = UINT;
    goto LAB_00179aea;
  case FLOAT32:
    dVar1 = (double)*(float *)((this->builder).ptr +
                              ((ulong)(this->builder).step * (ulong)index >> 3));
    goto LAB_00179ac2;
  case FLOAT64:
    dVar1 = *(double *)((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index >> 3));
LAB_00179ac2:
    __return_storage_ptr__->type = FLOAT;
    (__return_storage_ptr__->field_1).intValue = (int64_t)dVar1;
    break;
  case TEXT:
    _kjCondition.op.content.ptr =
         (char *)((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index >> 3));
    _kjCondition.left = (uint *)(this->builder).segment;
    _kjCondition._8_8_ = (this->builder).capTable;
    capnp::_::PointerBuilder::getBlob<capnp::Text>
              ((Builder *)(local_d0 + 0x10),(PointerBuilder *)&_kjCondition,(void *)0x0,0);
    (__return_storage_ptr__->field_1).textValue.content.size_ = local_b0;
    (__return_storage_ptr__->field_1).intValue = local_d0._16_8_;
    (__return_storage_ptr__->field_1).textValue.content.ptr = pcStack_b8;
    __return_storage_ptr__->type = TEXT;
    break;
  case DATA:
    _kjCondition.op.content.ptr =
         (char *)((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index >> 3));
    _kjCondition.left = (uint *)(this->builder).segment;
    _kjCondition._8_8_ = (this->builder).capTable;
    AVar19 = (ArrayPtr<unsigned_char>)
             capnp::_::PointerBuilder::getBlob<capnp::Data>
                       ((PointerBuilder *)&_kjCondition,(void *)0x0,0);
    __return_storage_ptr__->type = DATA;
    (__return_storage_ptr__->field_1).dataValue.super_ArrayPtr<unsigned_char> = AVar19;
    break;
  case LIST:
    TVar18 = (Type)Type::asList((Type *)this);
    _f = TVar18;
    if (TVar18.baseType == STRUCT &&
        ((undefined1  [16])TVar18 & (undefined1  [16])0xff0000) == (undefined1  [16])0x0) {
      _kjCondition.op.content.ptr =
           (char *)((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index_local >> 3));
      _kjCondition.left = (uint *)(this->builder).segment;
      _kjCondition._8_8_ = (this->builder).capTable;
      Type::asStruct((Type *)&f);
      elementSize = anon_unknown_71::structSizeFromSchema
                              ((StructSchema)in_stack_fffffffffffffed8.raw);
      __return_storage_ptr___00 = &local_58;
      capnp::_::PointerBuilder::getStructList
                (__return_storage_ptr___00,(PointerBuilder *)&_kjCondition,elementSize,(word *)0x0);
    }
    else {
      _kjCondition.op.content.ptr =
           (char *)((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index_local >> 3));
      _kjCondition.left = (uint *)(this->builder).segment;
      _kjCondition._8_8_ = (this->builder).capTable;
      WVar13 = LIST;
      if (((undefined1  [16])TVar18 & (undefined1  [16])0xff0000) == (undefined1  [16])0x0) {
        WVar13 = TVar18.baseType;
      }
      EVar12 = anon_unknown_71::elementSizeFor(WVar13);
      __return_storage_ptr___00 = &local_80;
      capnp::_::PointerBuilder::getList
                (__return_storage_ptr___00,(PointerBuilder *)&_kjCondition,EVar12,(word *)0x0);
    }
    SVar7 = __return_storage_ptr___00->structPointerCount;
    EVar12 = __return_storage_ptr___00->elementSize;
    uVar8 = __return_storage_ptr___00->field_0x27;
    *(StructDataBitCount *)((long)&__return_storage_ptr__->field_1 + 0x30) =
         __return_storage_ptr___00->structDataSize;
    *(StructPointerCount *)((long)&__return_storage_ptr__->field_1 + 0x34) = SVar7;
    *(ElementSize *)((long)&__return_storage_ptr__->field_1 + 0x36) = EVar12;
    *(undefined1 *)((long)&__return_storage_ptr__->field_1 + 0x37) = uVar8;
    pSVar5 = __return_storage_ptr___00->segment;
    pCVar6 = __return_storage_ptr___00->capTable;
    LVar9 = __return_storage_ptr___00->elementCount;
    BVar10 = __return_storage_ptr___00->step;
    (__return_storage_ptr__->field_1).listValue.builder.ptr = __return_storage_ptr___00->ptr;
    *(ListElementCount *)((long)&__return_storage_ptr__->field_1 + 0x28) = LVar9;
    *(BitsPerElementN<23> *)((long)&__return_storage_ptr__->field_1 + 0x2c) = BVar10;
    (__return_storage_ptr__->field_1).textValue.content.size_ = (size_t)pSVar5;
    (__return_storage_ptr__->field_1).listValue.builder.capTable = pCVar6;
    __return_storage_ptr__->type = LIST;
    (__return_storage_ptr__->field_1).listValue.schema.elementType = TVar18;
    break;
  case ENUM:
    EVar16 = Type::asEnum((Type *)this);
    uVar3 = *(undefined2 *)
             ((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index_local >> 3));
    __return_storage_ptr__->type = ENUM;
    (__return_storage_ptr__->field_1).enumValue.schema.super_Schema.raw =
         (RawBrandedSchema *)EVar16.super_Schema.raw;
    *(undefined2 *)&(__return_storage_ptr__->field_1).listValue.schema.elementType.field_4 = uVar3;
    break;
  case STRUCT:
    SVar14 = Type::asStruct((Type *)this);
    capnp::_::ListBuilder::getStructElement(&local_a8,&this->builder,index_local);
    *(undefined8 *)&(__return_storage_ptr__->field_1).listValue.builder.elementCount =
         local_a8._32_8_;
    (__return_storage_ptr__->field_1).listValue.builder.capTable = (CapTableBuilder *)local_a8.data;
    (__return_storage_ptr__->field_1).listValue.builder.ptr = (byte *)local_a8.pointers;
    (__return_storage_ptr__->field_1).textValue.content.ptr = (char *)local_a8.segment;
    (__return_storage_ptr__->field_1).textValue.content.size_ = (size_t)local_a8.capTable;
    __return_storage_ptr__->type = STRUCT;
    (__return_storage_ptr__->field_1).structValue.schema.super_Schema.raw =
         (RawBrandedSchema *)SVar14.super_Schema.raw;
    break;
  case INTERFACE:
    IVar17 = Type::asInterface((Type *)this);
    _f = *(Type *)&this->builder;
    capnp::_::PointerBuilder::getCapability((PointerBuilder *)local_d0);
    uVar11 = local_d0._8_8_;
    _kjCondition.left = (uint *)local_d0._0_8_;
    local_d0._8_8_ = (ClientHook *)0x0;
    __return_storage_ptr__->type = CAPABILITY;
    (__return_storage_ptr__->field_1).dataValue.super_ArrayPtr<unsigned_char>.ptr =
         (uchar *)local_d0._0_8_;
    (__return_storage_ptr__->field_1).textValue.content.ptr = (char *)uVar11;
    _kjCondition.right = 0;
    _kjCondition._12_4_ = 0;
    (__return_storage_ptr__->field_1).textValue.content.size_ = (size_t)IVar17.super_Schema.raw;
    _kjCondition.op.content.ptr = (char *)IVar17;
    kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
              ((Own<capnp::ClientHook,_std::nullptr_t> *)&_kjCondition);
    kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
              ((Own<capnp::ClientHook,_std::nullptr_t> *)local_d0);
    break;
  case ANY_POINTER:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32]>
              ((Fault *)&_kjCondition,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x47d,FAILED,(char *)0x0,"\"List(AnyPointer) not supported.\"",
               (char (*) [32])"List(AnyPointer) not supported.");
    kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
  default:
    __return_storage_ptr__->type = UNKNOWN;
  }
  return __return_storage_ptr__;
}

Assistant:

DynamicValue::Builder DynamicList::Builder::operator[](uint index) {
  KJ_REQUIRE(index < size(), "List index out-of-bounds.");

  switch (schema.whichElementType()) {
#define HANDLE_TYPE(name, discrim, typeName) \
    case schema::Type::discrim: \
      return builder.getDataElement<typeName>(bounded(index) * ELEMENTS);

    HANDLE_TYPE(void, VOID, Void)
    HANDLE_TYPE(bool, BOOL, bool)
    HANDLE_TYPE(int8, INT8, int8_t)
    HANDLE_TYPE(int16, INT16, int16_t)
    HANDLE_TYPE(int32, INT32, int32_t)
    HANDLE_TYPE(int64, INT64, int64_t)
    HANDLE_TYPE(uint8, UINT8, uint8_t)
    HANDLE_TYPE(uint16, UINT16, uint16_t)
    HANDLE_TYPE(uint32, UINT32, uint32_t)
    HANDLE_TYPE(uint64, UINT64, uint64_t)
    HANDLE_TYPE(float32, FLOAT32, float)
    HANDLE_TYPE(float64, FLOAT64, double)
#undef HANDLE_TYPE

    case schema::Type::TEXT:
      return builder.getPointerElement(bounded(index) * ELEMENTS)
                    .getBlob<Text>(nullptr, ZERO * BYTES);
    case schema::Type::DATA:
      return builder.getPointerElement(bounded(index) * ELEMENTS)
                    .getBlob<Data>(nullptr, ZERO * BYTES);

    case schema::Type::LIST: {
      ListSchema elementType = schema.getListElementType();
      if (elementType.whichElementType() == schema::Type::STRUCT) {
        return DynamicList::Builder(elementType,
            builder.getPointerElement(bounded(index) * ELEMENTS)
                   .getStructList(structSizeFromSchema(elementType.getStructElementType()),
                                  nullptr));
      } else {
        return DynamicList::Builder(elementType,
            builder.getPointerElement(bounded(index) * ELEMENTS)
                   .getList(elementSizeFor(elementType.whichElementType()), nullptr));
      }
    }

    case schema::Type::STRUCT:
      return DynamicStruct::Builder(schema.getStructElementType(),
                                    builder.getStructElement(bounded(index) * ELEMENTS));

    case schema::Type::ENUM:
      return DynamicEnum(schema.getEnumElementType(),
                         builder.getDataElement<uint16_t>(bounded(index) * ELEMENTS));

    case schema::Type::ANY_POINTER:
      KJ_FAIL_ASSERT("List(AnyPointer) not supported.");
      return nullptr;

    case schema::Type::INTERFACE:
      return DynamicCapability::Client(schema.getInterfaceElementType(),
                                       builder.getPointerElement(bounded(index) * ELEMENTS)
                                              .getCapability());
  }

  return nullptr;
}